

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::RelinkFailure::Run(RelinkFailure *this)

{
  CallLogWrapper *this_00;
  long *src_vs;
  GLuint program;
  long error;
  GLuint vbuf;
  GLuint vao;
  Vec4 v [4];
  char *varyings [2];
  long local_b8;
  long *local_b0 [2];
  long local_a0 [2];
  GLuint local_90;
  GLuint local_8c;
  long *local_88;
  undefined8 uStack_80;
  long local_78 [2];
  undefined1 *local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  char *local_48;
  char *pcStack_40;
  
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x16])(&local_88,this);
  src_vs = local_88;
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x17])(local_b0,this);
  program = PIQBase::CreateProgram((PIQBase *)this,(char *)src_vs,(char *)local_b0[0],false);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  this_00 = &(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glBindAttribLocation(this_00,program,0,"position");
  glu::CallLogWrapper::glBindAttribLocation(this_00,program,1,"pos");
  glu::CallLogWrapper::glBindFragDataLocation(this_00,program,0,"color");
  PIQBase::LinkProgram((PIQBase *)this,program);
  local_b8 = 0;
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"pos","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e3,&local_88,1,&local_b8);
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  glu::CallLogWrapper::glUseProgram(this_00,program);
  local_88 = (long *)0x3f800000bf800000;
  uStack_80 = 0x3f80000000000000;
  local_78[0] = -0x407fffff40800000;
  local_78[1] = 0x3f80000000000000;
  local_68 = &DAT_3f8000003f800000;
  uStack_60 = 0x3f80000000000000;
  local_58 = 0xbf8000003f800000;
  uStack_50 = 0x3f80000000000000;
  glu::CallLogWrapper::glGenVertexArrays(this_00,1,&local_8c);
  glu::CallLogWrapper::glBindVertexArray(this_00,local_8c);
  glu::CallLogWrapper::glGenBuffers(this_00,1,&local_90);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,local_90);
  glu::CallLogWrapper::glBufferData(this_00,0x8892,0x40,&local_88,0x88e4);
  glu::CallLogWrapper::glVertexAttribPointer(this_00,0,4,0x1406,'\0',0x10,(void *)0x0);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
  glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
  glu::CallLogWrapper::glClear(this_00,0x4100);
  glu::CallLogWrapper::glDisableVertexAttribArray(this_00,0);
  glu::CallLogWrapper::glDeleteVertexArrays(this_00,1,&local_8c);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&local_90);
  glu::CallLogWrapper::glBindAttribLocation(this_00,program,0,"pos");
  glu::CallLogWrapper::glBindAttribLocation(this_00,program,0,"position");
  local_48 = "q";
  pcStack_40 = "z";
  glu::CallLogWrapper::glTransformFeedbackVaryings(this_00,program,2,&local_48,0x8c8c);
  PIQBase::LinkProgram((PIQBase *)this,program);
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"position","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e3,local_b0,0xffffffff,&local_b8);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xc]
  )(this,0x502,&local_b8);
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"pos","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e3,local_b0,0xffffffff,&local_b8);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xc]
  )(this,0x502,&local_b8);
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"color","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e4,local_b0,0xffffffff,&local_b8);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xc]
  )(this,0x502,&local_b8);
  glu::CallLogWrapper::glDeleteProgram(this_00,program);
  return local_b8;
}

Assistant:

virtual long Run()
	{
		GLuint program = CreateProgram(VertexShader().c_str(), FragmentShader().c_str(), false);
		glBindAttribLocation(program, 0, "position");
		glBindAttribLocation(program, 1, "pos");
		glBindFragDataLocation(program, 0, "color");
		LinkProgram(program);

		long error = NO_ERROR;

		VerifyGetProgramResourceLocation(program, GL_PROGRAM_INPUT, "pos", 1, error);
		glUseProgram(program);

		tcu::Vec4 v[4] = { tcu::Vec4(-1, 1, 0, 1), tcu::Vec4(-1, -1, 0, 1), tcu::Vec4(1, 1, 0, 1),
						   tcu::Vec4(1, -1, 0, 1) };
		GLuint vao, vbuf;
		glGenVertexArrays(1, &vao);
		glBindVertexArray(vao);
		glGenBuffers(1, &vbuf);
		glBindBuffer(GL_ARRAY_BUFFER, vbuf);
		glBufferData(GL_ARRAY_BUFFER, sizeof(v), v, GL_STATIC_DRAW);
		glVertexAttribPointer(0, 4, GL_FLOAT, GL_FALSE, sizeof(tcu::Vec4), 0);
		glEnableVertexAttribArray(0);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
		glDisableVertexAttribArray(0);
		glDeleteVertexArrays(1, &vao);
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glDeleteBuffers(1, &vbuf);

		glBindAttribLocation(program, 0, "pos");
		glBindAttribLocation(program, 0, "position");
		const char* varyings[2] = { "q", "z" };
		glTransformFeedbackVaryings(program, 2, varyings, GL_INTERLEAVED_ATTRIBS);
		LinkProgram(program);

		VerifyGetProgramResourceLocation(program, GL_PROGRAM_INPUT, "position", -1, error);
		ExpectError(GL_INVALID_OPERATION, error);
		VerifyGetProgramResourceLocation(program, GL_PROGRAM_INPUT, "pos", -1, error);
		ExpectError(GL_INVALID_OPERATION, error);
		VerifyGetProgramResourceLocation(program, GL_PROGRAM_OUTPUT, "color", -1, error);
		ExpectError(GL_INVALID_OPERATION, error);

		glDeleteProgram(program);
		return error;
	}